

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_print_ext(void)

{
  uint32_t len;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  uint32_t len_00;
  FILE *tmpf;
  char *expected;
  int real_size;
  int size;
  size_t plain_len;
  char *plain;
  char *pos;
  
  _plan(5,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_print_ext");
  mp_snprint_ext = mp_snprint_ext_test;
  mp_fprint_ext = mp_fprint_ext_test;
  sVar3 = strlen("plain-str");
  pcVar4 = mp_encode_array(buf,4);
  pcVar4 = mp_encode_uint(pcVar4,100);
  len_00 = (uint32_t)sVar3;
  pcVar4 = mp_encode_ext(pcVar4,'\0',"plain-str",len_00);
  len = mp_sizeof_str(len_00);
  pcVar4 = mp_encode_extl(pcVar4,'\x01',len);
  pcVar4 = mp_encode_str(pcVar4,"plain-str",len_00);
  mp_encode_uint(pcVar4,200);
  iVar1 = mp_snprint((char *)0x0,0,buf);
  iVar2 = mp_snprint(str,0x3fff5,buf);
  _ok((uint)(iVar1 == iVar2),"size == real_size",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x537,
      "mp_snrpint size match");
  iVar2 = strcmp(str,"[100, plain-str, \"plain-str\", 200]");
  _ok((uint)(iVar2 == 0),"strcmp(str, expected) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x539,
      "str is correct");
  __stream = tmpfile();
  if (__stream == (FILE *)0x0) {
    abort();
  }
  iVar2 = mp_fprint((FILE *)__stream,buf);
  _ok((uint)(iVar1 == iVar2),"size == real_size",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x53f,
      "mp_fprint size match");
  rewind(__stream);
  sVar3 = fread(str,1,0x3fff5,__stream);
  _ok((uint)((int)sVar3 == iVar1),"real_size == size",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x542,
      "mp_fprint written correct number of bytes");
  str[(int)sVar3] = '\0';
  iVar1 = strcmp(str,"[100, plain-str, \"plain-str\", 200]");
  _ok((uint)(iVar1 == 0),"strcmp(str, expected) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x544,
      "str is correct");
  fclose(__stream);
  mp_snprint_ext = mp_snprint_ext_default;
  mp_fprint_ext = mp_fprint_ext_default;
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_print_ext");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_mp_print_ext(void)
{
	plan(5);
	header();
	mp_snprint_ext = mp_snprint_ext_test;
	mp_fprint_ext = mp_fprint_ext_test;

	char *pos = buf;
	const char *plain = "plain-str";
	size_t plain_len = strlen(plain);
	pos = mp_encode_array(pos, 4);
	pos = mp_encode_uint(pos, 100);
	pos = mp_encode_ext(pos, MP_EXT_TEST_PLAIN, plain, plain_len);
	pos = mp_encode_extl(pos, MP_EXT_TEST_MSGPACK,
			     mp_sizeof_str(plain_len));
	pos = mp_encode_str(pos, plain, plain_len);
	pos = mp_encode_uint(pos, 200);

	int size = mp_snprint(NULL, 0, buf);
	int real_size = mp_snprint(str, sizeof(str), buf);
	is(size, real_size, "mp_snrpint size match");
	const char *expected = "[100, plain-str, \"plain-str\", 200]";
	is(strcmp(str, expected), 0, "str is correct");

	FILE *tmpf = tmpfile();
	if (tmpf == NULL)
		abort();
	real_size = mp_fprint(tmpf, buf);
	is(size, real_size, "mp_fprint size match");
	rewind(tmpf);
	real_size = (int) fread(str, 1, sizeof(str), tmpf);
	is(real_size, size, "mp_fprint written correct number of bytes");
	str[real_size] = 0;
	is(strcmp(str, expected), 0, "str is correct");
	fclose(tmpf);

	mp_snprint_ext = mp_snprint_ext_default;
	mp_fprint_ext = mp_fprint_ext_default;
	footer();
	return check_plan();
}